

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeamData.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::BeamData::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,BeamData *this)

{
  ostream *poVar1;
  KStringStream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"BeamData:",9);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"\n\tAzimuth Center:    ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32AziCtr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tAzimuth Sweep:     ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32AziSwp);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tElevation Center:  ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32EleCtr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tElevation Sweep:   ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32EleSwp);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n\tBeam Sweep Sync:   ",0x15);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32SwpSyn);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString BeamData::GetAsString() const
{
    KStringStream ss;

    ss << "BeamData:"
       << "\n\tAzimuth Center:    " << m_f32AziCtr
       << "\n\tAzimuth Sweep:     " << m_f32AziSwp
       << "\n\tElevation Center:  " << m_f32EleCtr
       << "\n\tElevation Sweep:   " << m_f32EleSwp
       << "\n\tBeam Sweep Sync:   " << m_f32SwpSyn
       << "\n";

    return ss.str();
}